

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O2

shared_ptr<ComplexType> __thiscall SNMPTrap::generateVarBindList(SNMPTrap *this)

{
  ValueCallback *callback;
  shared_ptr<BER_CONTAINER> *psVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar4;
  shared_ptr<ComplexType> sVar5;
  shared_ptr<ComplexType> oidVarBind;
  shared_ptr<ComplexType> timestampVarBind;
  shared_ptr<ComplexType> ourVBList;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  __shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  _Alloc_hider _Stack_e0;
  SNMPTrap *local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_108._M_ptr._0_1_ = true;
  local_108._M_ptr._1_3_ = 0;
  std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)(local_f8 + 0x10));
  if (*(int *)(in_RSI + 0x48) == 1) {
    if (*(long *)(in_RSI + 0xe8) == 0) {
      (this->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)0x0;
      *(undefined8 *)&(this->super_SNMPPacket).reuse = 0;
      goto LAB_0010aacd;
    }
    local_128._0_4_ = 0x30;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_108);
    psVar1 = (shared_ptr<BER_CONTAINER> *)CONCAT44(local_108._M_ptr._4_4_,local_108._M_ptr._0_4_);
    OIDType::cloneOID((OIDType *)local_118);
    local_128._0_8_ = local_118;
    local_128._8_8_ = _Stack_110._M_pi;
    local_118 = (undefined1  [8])0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)(local_48 + 1),psVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
    psVar1 = (shared_ptr<BER_CONTAINER> *)CONCAT44(local_108._M_ptr._4_4_,local_108._M_ptr._0_4_);
    if (*(ValueCallback **)(in_RSI + 0xf0) == (ValueCallback *)0x0) {
      local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
      std::make_shared<TimestampType,int>((int *)local_118);
      this_00 = &_Stack_110;
      local_128._0_8_ = local_118;
      local_128._8_8_ = _Stack_110._M_pi;
      local_118 = (undefined1  [8])0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ComplexType::addValueToList((ComplexType *)local_60,psVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    }
    else {
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_f8,*(ValueCallback **)(in_RSI + 0xf0));
      std::static_pointer_cast<TimestampType,BER_CONTAINER>((shared_ptr<BER_CONTAINER> *)local_118);
      local_128._0_8_ = local_118;
      local_128._8_8_ = _Stack_110._M_pi;
      local_118 = (undefined1  [8])0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ComplexType::addValueToList((ComplexType *)(local_60 + 0x10),psVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    uVar2 = aStack_f0._8_8_;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_128,&local_108);
    ComplexType::addValueToList((ComplexType *)local_70,(shared_ptr<BER_CONTAINER> *)uVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    local_118._0_4_ = STRUCTURE;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_128);
    uVar2 = local_128._0_8_;
    OIDType::cloneOID((OIDType *)local_f8);
    local_118 = local_f8;
    _Stack_110._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_f0._M_allocated_capacity;
    local_f8 = (undefined1  [8])0x0;
    aStack_f0._M_allocated_capacity = 0;
    ComplexType::addValueToList((ComplexType *)(local_90 + 0x10),(shared_ptr<BER_CONTAINER> *)uVar2)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    uVar2 = local_128._0_8_;
    OIDType::cloneOID((OIDType *)local_f8);
    local_118 = local_f8;
    _Stack_110._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_f0._M_allocated_capacity;
    local_f8 = (undefined1  [8])0x0;
    aStack_f0._M_allocated_capacity = 0;
    ComplexType::addValueToList
              ((ComplexType *)((long)local_a0 + 0x10),(shared_ptr<BER_CONTAINER> *)uVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_90 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    uVar2 = aStack_f0._8_8_;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_118,
               (__shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    ComplexType::addValueToList((ComplexType *)(local_b0 + 0x10),(shared_ptr<BER_CONTAINER> *)uVar2)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_a0 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  }
  plVar4 = (long *)(in_RSI + 0x108);
  local_d8 = this;
  while (_Var3._M_p = _Stack_e0._M_p, plVar4 = (long *)*plVar4, plVar4 != (long *)(in_RSI + 0x108))
  {
    callback = (ValueCallback *)plVar4[2];
    if (callback != (ValueCallback *)0x0) {
      local_128._0_4_ = 0x30;
      std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_108);
      psVar1 = (shared_ptr<BER_CONTAINER> *)CONCAT44(local_108._M_ptr._4_4_,local_108._M_ptr._0_4_);
      OIDType::cloneOID((OIDType *)local_118);
      local_128._0_8_ = local_118;
      local_128._8_8_ = _Stack_110._M_pi;
      local_118 = (undefined1  [8])0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ComplexType::addValueToList((ComplexType *)(local_c0 + 0x10),psVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
      psVar1 = (shared_ptr<BER_CONTAINER> *)CONCAT44(local_108._M_ptr._4_4_,local_108._M_ptr._0_4_);
      ValueCallback::getValueForCallback((ValueCallback *)local_128,callback);
      ComplexType::addValueToList((ComplexType *)(local_d0 + 0x10),psVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      uVar2 = aStack_f0._8_8_;
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_128,&local_108);
      ComplexType::addValueToList
                ((ComplexType *)(local_f8 + 0x28),(shared_ptr<BER_CONTAINER> *)uVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    }
  }
  _Stack_e0._M_p = (pointer)0x0;
  (local_d8->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)aStack_f0._8_8_;
  *(pointer *)&(local_d8->super_SNMPPacket).reuse = _Var3._M_p;
  aStack_f0._8_8_ = (shared_ptr<BER_CONTAINER> *)0x0;
  this = local_d8;
LAB_0010aacd:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 0x18));
  sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPTrap::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPTrap");
    auto ourVBList = std::make_shared<ComplexType>(STRUCTURE);
    // If we're an SNMPv2 Trap, our first two are timestamp and OIDType, v1 already has them included
    if(this->snmpVersion == SNMP_VERSION_2C){
        if(!this->trapOID){
            return nullptr;
        }
        // Timestamp
        auto timestampVarBind = std::make_shared<ComplexType>(STRUCTURE);
        timestampVarBind->addValueToList(timestampOID->cloneOID());

        if(uptimeCallback){
            timestampVarBind->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
        } else {
            timestampVarBind->addValueToList(std::make_shared<TimestampType>(0));
        }
        ourVBList->addValueToList(timestampVarBind);

        // OID
        auto oidVarBind = std::make_shared<ComplexType>(STRUCTURE);
        oidVarBind->addValueToList(snmpTrapOID->cloneOID());
        oidVarBind->addValueToList(trapOID->cloneOID());
        ourVBList->addValueToList(oidVarBind);
    }

    for(auto value : this->callbacks){
        if(!value) continue;
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(value->OID->cloneOID());
        varBind->addValueToList(ValueCallback::getValueForCallback(value));

        ourVBList->addValueToList(varBind);
    }

    return ourVBList;
}